

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int main(void)

{
  int iVar1;
  ulong uVar2;
  
  plan(1);
  uVar2 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar2 & 0xffffffff);
  fputc(10,_stdout);
  srand((uint)uVar2);
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_align_down");
  _ok(1,"true","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/util.c",
      0xa1,"line %d",0xa1);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_align_down");
  check_plan();
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main(void)
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(1);
#endif

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

#ifdef ENABLE_ASAN
	test_asan_poison_assumptions();
	test_asan_alloc();
#endif
	test_align_down();

	return check_plan();
}